

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

string * __thiscall
Database::getLatestEntry_abi_cxx11_(string *__return_storage_ptr__,Database *this)

{
  size_type sVar1;
  pointer pcVar2;
  iterator __begin1;
  iterator __end1;
  iterator local_70;
  iterator local_50;
  
  begin(&local_70,this);
  end(&local_50,this);
  do {
    if (local_50.files_it.current._M_current == local_50.files_end.current._M_current) {
      if (local_70.files_it.current._M_current == local_70.files_end.current._M_current)
      goto LAB_00119189;
    }
    else if ((((local_70.files_it.current._M_current == local_50.files_it.current._M_current) &&
              (local_70.files_end.current._M_current == local_50.files_end.current._M_current)) &&
             (local_70.lines_it.current._M_current == local_50.lines_it.current._M_current)) &&
            (local_70.lines_end.current._M_current == local_50.lines_end.current._M_current)) {
LAB_00119189:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    if (local_70.lines_it.current._M_current == local_70.lines_end.current._M_current) {
      __assert_fail("lines_it != lines_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/GothenburgBitFactory[P]timewarrior/src/Database.cpp"
                    ,0x6b,"const std::string &Database::iterator::operator*() const");
    }
    sVar1 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)local_70.lines_it.current._M_current + -0x20))->_M_string_length;
    if (sVar1 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)local_70.lines_it.current._M_current + -0x20))->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
      return __return_storage_ptr__;
    }
    iterator::operator++(&local_70);
  } while( true );
}

Assistant:

std::string Database::getLatestEntry ()
{
  for (auto& line : *this)
  {
    if (! line.empty ())
    {
      return line;
    }
  }

  return "";
}